

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser_test.cc
# Opt level: O3

Test * DyndepParserTestOutEOF::Create(void)

{
  Test *pTVar1;
  
  pTVar1 = (Test *)operator_new(0x278);
  pTVar1->failed_ = false;
  pTVar1->assertion_failures_ = 0;
  pTVar1->_vptr_Test = (_func_int **)&PTR__DyndepParserTest_001d1e88;
  State::State((State *)(pTVar1 + 1));
  *(undefined ***)&pTVar1[0x15].failed_ = &PTR__VirtualFileSystem_001d47a0;
  *(undefined4 *)&pTVar1[0x19].failed_ = 0;
  pTVar1[0x1a]._vptr_Test = (_func_int **)0x0;
  pTVar1[0x16]._vptr_Test = (_func_int **)0x0;
  pTVar1[0x16].failed_ = false;
  *(undefined3 *)&pTVar1[0x16].field_0x9 = 0;
  pTVar1[0x16].assertion_failures_ = 0;
  pTVar1[0x17]._vptr_Test = (_func_int **)0x0;
  pTVar1[0x17].failed_ = false;
  *(undefined3 *)&pTVar1[0x17].field_0x9 = 0;
  pTVar1[0x17].assertion_failures_ = 0;
  pTVar1[0x18]._vptr_Test = (_func_int **)0x0;
  pTVar1[0x18].failed_ = false;
  *(undefined3 *)&pTVar1[0x18].field_0x9 = 0;
  pTVar1[0x18].assertion_failures_ = 0;
  *(bool **)&pTVar1[0x1a].failed_ = &pTVar1[0x19].failed_;
  pTVar1[0x1b]._vptr_Test = (_func_int **)&pTVar1[0x19].failed_;
  pTVar1[0x1b].failed_ = false;
  *(undefined3 *)&pTVar1[0x1b].field_0x9 = 0;
  pTVar1[0x1b].assertion_failures_ = 0;
  *(undefined4 *)&pTVar1[0x1c].failed_ = 0;
  pTVar1[0x1d]._vptr_Test = (_func_int **)0x0;
  *(bool **)&pTVar1[0x1d].failed_ = &pTVar1[0x1c].failed_;
  pTVar1[0x1e]._vptr_Test = (_func_int **)&pTVar1[0x1c].failed_;
  pTVar1[0x1e].failed_ = false;
  *(undefined3 *)&pTVar1[0x1e].field_0x9 = 0;
  pTVar1[0x1e].assertion_failures_ = 0;
  *(undefined4 *)&pTVar1[0x1f].failed_ = 0;
  pTVar1[0x20]._vptr_Test = (_func_int **)0x0;
  *(bool **)&pTVar1[0x20].failed_ = &pTVar1[0x1f].failed_;
  pTVar1[0x21]._vptr_Test = (_func_int **)&pTVar1[0x1f].failed_;
  pTVar1[0x21].failed_ = false;
  *(undefined3 *)&pTVar1[0x21].field_0x9 = 0;
  pTVar1[0x21].assertion_failures_ = 0;
  *(undefined4 *)&pTVar1[0x22]._vptr_Test = 1;
  *(bool **)&pTVar1[0x22].failed_ = &pTVar1[0x23].failed_;
  pTVar1[0x23]._vptr_Test = (_func_int **)0x0;
  pTVar1[0x23].failed_ = false;
  *(undefined4 *)&pTVar1[0x25]._vptr_Test = 0;
  pTVar1[0x25].failed_ = false;
  *(undefined3 *)&pTVar1[0x25].field_0x9 = 0;
  pTVar1[0x25].assertion_failures_ = 0;
  pTVar1[0x26]._vptr_Test = (_func_int **)(pTVar1 + 0x25);
  *(Test **)&pTVar1[0x26].failed_ = pTVar1 + 0x25;
  pTVar1[0x27]._vptr_Test = (_func_int **)0x0;
  pTVar1->_vptr_Test = (_func_int **)&PTR__DyndepParserTest_001d1880;
  g_current_test = pTVar1;
  return pTVar1;
}

Assistant:

TEST_F(DyndepParserTest, OutEOF) {
  const char kInput[] =
"ninja_dyndep_version = 1\n"
"build out";
  DyndepParser parser(&state_, &fs_, &dyndep_file_);
  string err;
  EXPECT_FALSE(parser.ParseTest(kInput, &err));
  EXPECT_EQ("input:2: unexpected EOF\n"
            "build out\n"
            "         ^ near here", err);
}